

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

void makeliteral_cc(strbuf *b,termchar *c,unsigned_long *state)

{
  undefined1 local_48 [8];
  termchar z;
  unsigned_long zstate;
  unsigned_long *state_local;
  termchar *c_local;
  strbuf *b_local;
  
  state_local = &c->chr;
  while( true ) {
    if ((int)state_local[3] == 0) {
      local_48 = (undefined1  [8])0x0;
      z.cc_next = L'\0';
      z._28_4_ = 0;
      makeliteral_chr(b,(termchar *)local_48,(unsigned_long *)&z.cc_next);
      return;
    }
    state_local = state_local + (long)(int)state_local[3] * 4;
    if (((termchar *)state_local)->chr == 0) break;
    z.cc_next = L'\0';
    z._28_4_ = 0;
    makeliteral_chr(b,(termchar *)state_local,(unsigned_long *)&z.cc_next);
  }
  __assert_fail("c->chr != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                ,0x2a6,"void makeliteral_cc(strbuf *, termchar *, unsigned long *)");
}

Assistant:

static void makeliteral_cc(strbuf *b, termchar *c, unsigned long *state)
{
    /*
     * For combining characters, I just encode a bunch of ordinary
     * chars using makeliteral_chr, and terminate with a \0
     * character (which I know won't come up as a combining char
     * itself).
     *
     * I don't use the stateful encoding in makeliteral_chr.
     */
    unsigned long zstate;
    termchar z;

    while (c->cc_next) {
        c += c->cc_next;

        assert(c->chr != 0);

        zstate = 0;
        makeliteral_chr(b, c, &zstate);
    }

    z.chr = 0;
    zstate = 0;
    makeliteral_chr(b, &z, &zstate);
}